

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::del
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path)

{
  Client *client;
  Url local_40;
  Path *local_20;
  Path *path_local;
  KeyValue *this_local;
  
  client = this->client_;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (KeyValue *)__return_storage_ptr__;
  getUrl(&local_40,this,path);
  HttpConsumer::del(__return_storage_ptr__,client,&local_40);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::KeyValue::del(const Vault::Path &path) {
  return Vault::HttpConsumer::del(client_, getUrl(path));
}